

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::DisableConstraintSyntax::setChild
          (DisableConstraintSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0048c3c8 + *(int *)(&DAT_0048c3c8 + index * 4)))();
  return;
}

Assistant:

void DisableConstraintSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: disable = child.token(); return;
        case 1: soft = child.token(); return;
        case 2: name = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}